

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,long *next)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  
  pcVar1 = (state->cur_)._M_current;
  for (uVar6 = 0; uVar6 < *(uint *)(this + 8); uVar6 = uVar6 + 1) {
    bVar2 = matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
            ::match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
                        *)this,state);
    if (!bVar2) break;
  }
  if (this[0x18] ==
      (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>,mpl_::bool_<true>>
       )0x1) {
    pcVar5 = pcVar1 + ((state->end_)._M_current != pcVar1);
    if (uVar6 < *(uint *)(this + 8)) {
      pcVar5 = (state->cur_)._M_current;
    }
    pcVar4 = pcVar1 + ((state->end_)._M_current != pcVar1);
    if (uVar6 != 0) {
      pcVar4 = pcVar5;
    }
    (state->next_search_)._M_current = pcVar4;
  }
  if (uVar6 < *(uint *)(this + 4)) {
LAB_0012ba49:
    (state->cur_)._M_current = pcVar1;
    bVar2 = false;
  }
  else {
    while( true ) {
      cVar3 = (**(code **)(*next + 0x10))(next,state);
      if (cVar3 != '\0') break;
      if (uVar6 == *(uint *)(this + 4)) goto LAB_0012ba49;
      uVar6 = uVar6 - 1;
      (state->cur_)._M_current = (state->cur_)._M_current + -1;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }